

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_eq_var(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  secp256k1_gej tmp;
  secp256k1_fe *in_stack_00000168;
  secp256k1_gej *in_stack_00000170;
  secp256k1_gej *in_stack_00000178;
  secp256k1_gej *in_stack_00000180;
  secp256k1_gej *in_stack_ffffffffffffff58;
  secp256k1_gej *in_stack_ffffffffffffff60;
  
  secp256k1_gej_verify(in_stack_ffffffffffffff60);
  secp256k1_gej_verify(in_stack_ffffffffffffff60);
  secp256k1_gej_neg(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  secp256k1_gej_add_var(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1429a0);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_var(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej tmp;
    SECP256K1_GEJ_VERIFY(b);
    SECP256K1_GEJ_VERIFY(a);

    secp256k1_gej_neg(&tmp, a);
    secp256k1_gej_add_var(&tmp, &tmp, b, NULL);
    return secp256k1_gej_is_infinity(&tmp);
}